

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  __node_base_ptr *this_00;
  bool bVar1;
  uint32_t uVar2;
  CompilerError *pCVar3;
  ulong uVar4;
  char (*in_R8) [2];
  string *in_R9;
  char (*in_stack_fffffffffffff6c8) [2];
  char (*in_stack_fffffffffffff6d0) [2];
  Op local_8d4;
  string local_8c8;
  spirv_cross local_8a8 [8];
  string bitcast_op;
  string local_880;
  uint local_860;
  uint local_85c;
  uint32_t r_1;
  uint32_t c_1;
  string local_838 [32];
  string local_818;
  undefined1 local_7f8 [8];
  SPIRType scalar_type_1;
  undefined1 local_684 [4];
  string local_680;
  uint local_65c;
  string local_658 [4];
  uint32_t c;
  string local_638 [32];
  string local_618 [32];
  string local_5f8;
  undefined1 local_5d8 [8];
  SPIRType vector_type;
  char *load_op_1;
  string local_478;
  uint local_454;
  string local_450 [4];
  uint32_t r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0 [32];
  string local_3d0;
  undefined1 local_3b0 [8];
  SPIRType scalar_type;
  char *local_240;
  char *load_op;
  string local_218;
  string local_1f8 [8];
  string template_expr;
  string load_expr;
  undefined1 local_1b0 [3];
  bool templated_load;
  string base;
  undefined1 local_180 [8];
  SPIRType target_type;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  string *expr_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  target_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = Compiler::is_scalar((Compiler *)this,
                              (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
  if (bVar1) {
    local_8d4 = OpTypeInt;
  }
  else {
    local_8d4 = *(Op *)((long)&target_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4);
  }
  SPIRType::SPIRType((SPIRType *)local_180,local_8d4);
  target_type.super_IVariant.self.id = 8;
  target_type.basetype = *(BaseType *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt
  ;
  target_type.width =
       *(uint32_t *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
  bVar1 = VectorView<unsigned_int>::empty
                    ((VectorView<unsigned_int> *)
                     (target_type.member_name_cache._M_h._M_single_bucket + 4));
  if (bVar1) {
    if (*(int *)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt == 0xf) {
      read_access_chain_struct(this,lhs,chain);
      base.field_2._8_4_ = 1;
    }
    else {
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4) !=
           0x20) && (((this->hlsl_options).enable_16bit_types & 1U) == 0)) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar3,
                   "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
                  );
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::__cxx11::string::string((string *)local_1b0,(string *)&chain->base);
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
      if (bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).self);
        CompilerGLSL::convert_non_uniform_expression
                  (&this->super_CompilerGLSL,(string *)local_1b0,uVar2);
      }
      bVar1 = 0x3d < (this->hlsl_options).shader_model;
      ::std::__cxx11::string::string((string *)(template_expr.field_2._M_local_buf + 8));
      ::std::__cxx11::string::string(local_1f8);
      if (bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&load_op,this,target_type.member_name_cache._M_h._M_single_bucket,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_218,(spirv_cross *)0x4a182b,(char (*) [2])&load_op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a22b3,
                   in_R8);
        ::std::__cxx11::string::operator=(local_1f8,(string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string((string *)&load_op);
      }
      if ((*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) == 1)
         && ((chain->row_major_matrix & 1U) == 0)) {
        local_240 = (char *)0x0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          local_240 = "Load";
          break;
        case 2:
          local_240 = "Load2";
          break;
        case 3:
          local_240 = "Load3";
          break;
        case 4:
          local_240 = "Load4";
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          local_240 = "Load";
        }
        in_R9 = (string *)0x4a488c;
        join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket,
                   (spirv_cross *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aff3f,
                   (char (*) [2])&local_240,(char **)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                   (char (*) [2])&chain->dynamic_index,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &chain->static_index,(int *)0x4b01ae,in_stack_fffffffffffff6d0);
        ::std::__cxx11::string::operator=
                  ((string *)(template_expr.field_2._M_local_buf + 8),
                   (string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
        ::std::__cxx11::string::~string
                  ((string *)&scalar_type.member_name_cache._M_h._M_single_bucket);
      }
      else if (*(int *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4) ==
               1) {
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_3b0,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type.basetype = Void;
          scalar_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_3f0,this,local_3b0,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_3d0,(spirv_cross *)0x4a182b,(char (*) [2])local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a22b3,
                     in_R8);
          ::std::__cxx11::string::operator=(local_1f8,(string *)&local_3d0);
          ::std::__cxx11::string::~string((string *)&local_3d0);
          ::std::__cxx11::string::~string(local_3f0);
          if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_430,this,target_type.member_name_cache._M_h._M_single_bucket,0);
            ::std::operator+(&local_410,&local_430,"(");
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_410);
            ::std::__cxx11::string::~string((string *)&local_410);
            ::std::__cxx11::string::~string((string *)&local_430);
          }
          SPIRType::~SPIRType((SPIRType *)local_3b0);
        }
        else if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_450,this,local_180,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_450);
          ::std::__cxx11::string::~string(local_450);
          ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(")
          ;
        }
        for (local_454 = 0;
            local_454 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
            local_454 = local_454 + 1) {
          in_R9 = &chain->dynamic_index;
          load_op_1._4_4_ = chain->static_index + local_454 * chain->matrix_stride;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    (&local_478,(spirv_cross *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                     (char (*) [6])local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                     (char (*) [2])in_R9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&load_op_1 + 4),(uint *)0x4b01ae,in_stack_fffffffffffff6c8);
          ::std::__cxx11::string::operator+=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_478);
          ::std::__cxx11::string::~string((string *)&local_478);
          if (local_454 + 1 <
              *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),", ");
          }
        }
        if (1 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
          ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")")
          ;
        }
      }
      else if ((chain->row_major_matrix & 1U) == 0) {
        vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
        switch(*(undefined4 *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) {
        case 1:
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x490799;
          break;
        case 2:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_19ccfc;
          break;
        case 3:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_19cd08;
          break;
        case 4:
          vector_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)anon_var_dwarf_19cd14;
          break;
        default:
          pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar3,"Unknown vector size.");
          __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (bVar1) {
          SPIRType::SPIRType((SPIRType *)local_5d8,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          vector_type.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_618,this,local_5d8,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_5f8,(spirv_cross *)0x4a182b,(char (*) [2])local_618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a22b3,
                     in_R8);
          ::std::__cxx11::string::operator=(local_1f8,(string *)&local_5f8);
          ::std::__cxx11::string::~string((string *)&local_5f8);
          ::std::__cxx11::string::~string(local_618);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_638,this,target_type.member_name_cache._M_h._M_single_bucket,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_638);
          ::std::__cxx11::string::~string(local_638);
          vector_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x490799;
          SPIRType::~SPIRType((SPIRType *)local_5d8);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_658,this,local_180,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),local_658);
          ::std::__cxx11::string::~string(local_658);
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(");
        for (local_65c = 0;
            local_65c <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
            local_65c = local_65c + 1) {
          local_684 = (undefined1  [4])(chain->static_index + local_65c * chain->matrix_stride);
          in_R9 = (string *)0x4a488c;
          join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)(local_684 + 4),(spirv_cross *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4aff3f,
                     (char (*) [2])&vector_type.member_name_cache._M_h._M_single_bucket,
                     (char **)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                     (char (*) [2])&chain->dynamic_index,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_684,
                     (uint *)0x4b01ae,in_stack_fffffffffffff6d0);
          ::std::__cxx11::string::operator+=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)(local_684 + 4));
          ::std::__cxx11::string::~string((string *)(local_684 + 4));
          if (local_65c + 1 <
              *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4)) {
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),", ");
          }
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")");
      }
      else {
        if (bVar1) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type_1.member_name_cache._M_h._M_single_bucket,this,
                     target_type.member_name_cache._M_h._M_single_bucket,0);
          this_00 = &scalar_type_1.member_name_cache._M_h._M_single_bucket;
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)this_00);
          ::std::__cxx11::string::~string((string *)this_00);
          SPIRType::SPIRType((SPIRType *)local_7f8,
                             (SPIRType *)target_type.member_name_cache._M_h._M_single_bucket);
          scalar_type_1.basetype = Void;
          scalar_type_1.width = 1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_838,this,local_7f8,0);
          join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (&local_818,(spirv_cross *)0x4a182b,(char (*) [2])local_838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a22b3,
                     in_R8);
          ::std::__cxx11::string::operator=(local_1f8,(string *)&local_818);
          ::std::__cxx11::string::~string((string *)&local_818);
          ::std::__cxx11::string::~string(local_838);
          SPIRType::~SPIRType((SPIRType *)local_7f8);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&r_1,this,local_180,0);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&r_1);
          ::std::__cxx11::string::~string((string *)&r_1);
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),"(");
        for (local_85c = 0;
            local_85c <
            *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4);
            local_85c = local_85c + 1) {
          for (local_860 = 0;
              local_860 < *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt;
              local_860 = local_860 + 1) {
            in_R9 = &chain->dynamic_index;
            bitcast_op.field_2._12_4_ =
                 chain->static_index +
                 local_85c *
                 (*(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt + 4
                           ) >> 3) + local_860 * chain->matrix_stride;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      (&local_880,(spirv_cross *)local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                       (char (*) [6])local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c
                       ,(char (*) [2])in_R9,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&bitcast_op.field_2 + 0xc),(uint *)0x4b01ae,in_stack_fffffffffffff6c8)
            ;
            ::std::__cxx11::string::operator+=
                      ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_880);
            ::std::__cxx11::string::~string((string *)&local_880);
            if ((local_860 + 1 <
                 *(uint *)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt) ||
               (local_85c + 1 <
                *(uint *)((long)&target_type.member_name_cache._M_h._M_single_bucket[3]._M_nxt + 4))
               ) {
              ::std::__cxx11::string::operator+=
                        ((string *)(template_expr.field_2._M_local_buf + 8),", ");
            }
          }
        }
        ::std::__cxx11::string::operator+=((string *)(template_expr.field_2._M_local_buf + 8),")");
      }
      if (!bVar1) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
                  (local_8a8,this,target_type.member_name_cache._M_h._M_single_bucket,local_180);
        uVar4 = ::std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_8c8,local_8a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
                     (char (*) [2])((long)&template_expr.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
                     (char (*) [2])in_R9);
          ::std::__cxx11::string::operator=
                    ((string *)(template_expr.field_2._M_local_buf + 8),(string *)&local_8c8);
          ::std::__cxx11::string::~string((string *)&local_8c8);
        }
        ::std::__cxx11::string::~string((string *)local_8a8);
      }
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        CompilerGLSL::
        statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,lhs,(char (*) [4])0x4a41f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&template_expr.field_2 + 8),(char (*) [2])0x4af37c);
      }
      else {
        if (expr == (string *)0x0) {
          __assert_fail("expr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_hlsl.cpp"
                        ,0x1277,
                        "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                       );
        }
        ::std::__cxx11::string::operator=
                  ((string *)expr,(string *)(template_expr.field_2._M_local_buf + 8));
      }
      ::std::__cxx11::string::~string(local_1f8);
      ::std::__cxx11::string::~string((string *)(template_expr.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)local_1b0);
      base.field_2._8_4_ = 0;
    }
  }
  else {
    read_access_chain_array(this,lhs,chain);
    base.field_2._8_4_ = 1;
  }
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}